

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

char * failureMessageForOp(ComparisonOperation op)

{
  ComparisonOperation op_local;
  char *local_8;
  
  switch(op) {
  case CustomCompare:
    local_8 = "Compared values are not the same";
    break;
  case Equal:
    local_8 = "The computed value is expected to be equal to the baseline, but is not";
    break;
  case NotEqual:
    local_8 = "The computed value is expected to be different from the baseline, but is not";
    break;
  case LessThan:
    local_8 = "The computed value is expected to be less than the baseline, but is not";
    break;
  case LessThanOrEqual:
    local_8 = "The computed value is expected to be less than or equal to the baseline, but is not";
    break;
  case GreaterThan:
    local_8 = "The computed value is expected to be greater than the baseline, but is not";
    break;
  case GreaterThanOrEqual:
    local_8 = 
    "The computed value is expected to be greater than or equal to the baseline, but is not";
    break;
  case ThreeWayCompare:
    local_8 = "The result of operator<=>() is not what was expected";
  }
  return local_8;
}

Assistant:

static const char *failureMessageForOp(QTest::ComparisonOperation op)
{
    using namespace QTest;
    switch (op) {
    case ComparisonOperation::CustomCompare:
        return "Compared values are not the same"; /* not used */
    case ComparisonOperation::ThreeWayCompare:
        return "The result of operator<=>() is not what was expected";
    case ComparisonOperation::Equal:
        return "The computed value is expected to be equal to the baseline, but is not";
    case ComparisonOperation::NotEqual:
        return "The computed value is expected to be different from the baseline, but is not";
    case ComparisonOperation::LessThan:
        return "The computed value is expected to be less than the baseline, but is not";
    case ComparisonOperation::LessThanOrEqual:
        return "The computed value is expected to be less than or equal to the baseline, but is not";
    case ComparisonOperation::GreaterThan:
        return "The computed value is expected to be greater than the baseline, but is not";
    case ComparisonOperation::GreaterThanOrEqual:
        return "The computed value is expected to be greater than or equal to the baseline, but is not";
    }
    Q_UNREACHABLE_RETURN("");
}